

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinside.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::JoinCondition::CreateExpression
          (JoinCondition *this,vector<duckdb::JoinCondition,_true> *conditions)

{
  pointer pJVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  pointer *__ptr;
  pointer pJVar2;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> expr;
  undefined1 local_60 [16];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  JoinCondition local_48;
  
  (this->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  pJVar2 = (conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>)
           .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pJVar1 = (conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>)
           .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pJVar2 != pJVar1) {
    do {
      local_48.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
            &(pJVar2->left).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>;
      local_48.right.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (pJVar2->right).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pJVar2->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false> =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
      (pJVar2->right).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
      ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      local_48.comparison = pJVar2->comparison;
      CreateExpression((JoinCondition *)local_60,&local_48);
      if (local_48.right.
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
          0x0) {
        (**(code **)(*(long *)local_48.right.
                              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))
                  ();
      }
      local_48.right.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      if (local_48.left.
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
          0x0) {
        (**(code **)(*(long *)local_48.left.
                              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))
                  ();
      }
      this_00._M_head_impl = (Expression *)local_60._0_8_;
      local_48.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      if ((Expression *)
          (this->left).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> == (Expression *)0x0) {
        local_60._0_8_ =
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
      }
      else {
        this_00._M_head_impl = (Expression *)operator_new(0x70);
        local_50._M_head_impl = (Expression *)local_60._0_8_;
        local_60._0_8_ =
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        local_60._8_8_ =
             (this->left).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>;
        (this->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
        BoundConjunctionExpression::BoundConjunctionExpression
                  ((BoundConjunctionExpression *)this_00._M_head_impl,CONJUNCTION_AND,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_50,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   (local_60 + 8));
        if ((Expression *)local_60._8_8_ != (Expression *)0x0) {
          (**(code **)(*(long *)local_60._8_8_ + 8))();
        }
        local_60._8_8_ = (Expression *)0x0;
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_50._M_head_impl != (Expression *)0x0) {
          (*(((Expression *)&(local_50._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
      }
      (this->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false> =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)this_00._M_head_impl;
      if ((BoundConjunctionExpression *)local_60._0_8_ != (BoundConjunctionExpression *)0x0) {
        (*(((Expression *)local_60._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      pJVar2 = pJVar2 + 1;
    } while (pJVar2 != pJVar1);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> JoinCondition::CreateExpression(vector<JoinCondition> conditions) {
	unique_ptr<Expression> result;
	for (auto &cond : conditions) {
		auto expr = CreateExpression(std::move(cond));
		if (!result) {
			result = std::move(expr);
		} else {
			auto conj = make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND, std::move(expr),
			                                                  std::move(result));
			result = std::move(conj);
		}
	}
	return result;
}